

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

long xmlByteConsumed(xmlParserCtxtPtr ctxt)

{
  xmlParserInputPtr pxVar1;
  xmlCharEncodingHandler *handler_00;
  int iVar2;
  xmlParserInputBufferPtr pxVar3;
  uint uVar4;
  ulong uVar5;
  xmlCharEncodingHandler *handler;
  uchar *cur;
  xmlChar *pxVar6;
  uchar convbuf [32000];
  int local_7d40;
  int local_7d3c;
  uchar local_7d38 [32008];
  
  pxVar6 = (xmlChar *)0xffffffffffffffff;
  if ((ctxt != (xmlParserCtxtPtr)0x0) && (pxVar1 = ctxt->input, pxVar1 != (xmlParserInputPtr)0x0)) {
    pxVar3 = pxVar1->buf;
    if ((pxVar3 == (xmlParserInputBufferPtr)0x0) ||
       (handler_00 = pxVar3->encoder, handler_00 == (xmlCharEncodingHandler *)0x0)) {
      pxVar6 = pxVar1->cur + (pxVar1->consumed - (long)pxVar1->base);
    }
    else {
      pxVar6 = pxVar1->cur;
      uVar5 = 0;
      if (pxVar1->end != pxVar6 && -1 < (long)pxVar1->end - (long)pxVar6) {
        do {
          local_7d3c = *(int *)&pxVar1->end - (int)pxVar6;
          local_7d40 = 32000;
          iVar2 = xmlEncOutputChunk(handler_00,local_7d38,&local_7d40,pxVar6,&local_7d3c);
          if (local_7d40 < 1 && iVar2 < 0) {
            return -1;
          }
          uVar4 = (int)uVar5 + local_7d40;
          uVar5 = (ulong)uVar4;
          pxVar6 = pxVar6 + local_7d3c;
        } while (iVar2 < 0);
        uVar5 = (ulong)uVar4;
        pxVar3 = pxVar1->buf;
      }
      pxVar6 = (xmlChar *)0xffffffffffffffff;
      if (uVar5 <= pxVar3->rawconsumed) {
        pxVar6 = (xmlChar *)(pxVar3->rawconsumed - uVar5);
      }
    }
  }
  return (long)pxVar6;
}

Assistant:

long
xmlByteConsumed(xmlParserCtxtPtr ctxt) {
    xmlParserInputPtr in;

    if (ctxt == NULL) return(-1);
    in = ctxt->input;
    if (in == NULL)  return(-1);
    if ((in->buf != NULL) && (in->buf->encoder != NULL)) {
        unsigned int unused = 0;
	xmlCharEncodingHandler * handler = in->buf->encoder;
        /*
	 * Encoding conversion, compute the number of unused original
	 * bytes from the input not consumed and subtract that from
	 * the raw consumed value, this is not a cheap operation
	 */
        if (in->end - in->cur > 0) {
	    unsigned char convbuf[32000];
	    const unsigned char *cur = (const unsigned char *)in->cur;
	    int toconv = in->end - in->cur, written = 32000;

	    int ret;

            do {
                toconv = in->end - cur;
                written = 32000;
                ret = xmlEncOutputChunk(handler, &convbuf[0], &written,
                                        cur, &toconv);
                if (ret < 0) {
                    if (written > 0)
                        ret = -2;
                    else
                        return(-1);
                }
                unused += written;
                cur += toconv;
            } while (ret == -2);
	}
	if (in->buf->rawconsumed < unused)
	    return(-1);
	return(in->buf->rawconsumed - unused);
    }
    return(in->consumed + (in->cur - in->base));
}